

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int I420Interpolate(uint8_t *src0_y,int src0_stride_y,uint8_t *src0_u,int src0_stride_u,
                   uint8_t *src0_v,int src0_stride_v,uint8_t *src1_y,int src1_stride_y,
                   uint8_t *src1_u,int src1_stride_u,uint8_t *src1_v,int src1_stride_v,
                   uint8_t *dst_y,int dst_stride_y,uint8_t *dst_u,int dst_stride_u,uint8_t *dst_v,
                   int dst_stride_v,int width,int height,int interpolation)

{
  int iVar1;
  int src_stride1;
  undefined4 in_ECX;
  long in_RDX;
  long in_RDI;
  long in_R8;
  undefined4 in_R9D;
  int unaff_retaddr;
  long in_stack_00000008;
  long in_stack_00000018;
  int halfheight;
  int halfwidth;
  long in_stack_00000058;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffbc;
  int src_stride0;
  undefined4 in_stack_ffffffffffffffd8;
  int width_00;
  int in_stack_fffffffffffffff8;
  undefined4 local_4;
  
  iVar1 = src1_stride_y + 1 >> 1;
  src_stride1 = (int)src1_u + 1 >> 1;
  if ((((((in_RDI == 0) || (in_RDX == 0)) || (in_R8 == 0)) ||
       ((in_stack_00000008 == 0 || (in_stack_00000018 == 0)))) ||
      ((src0_v == (uint8_t *)0x0 || ((src0_u == (uint8_t *)0x0 || (src0_y == (uint8_t *)0x0)))))) ||
     ((in_stack_00000058 == 0 || ((src1_stride_y < 1 || ((int)src1_u == 0)))))) {
    local_4 = -1;
  }
  else {
    InterpolatePlane((uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                     (int)((ulong)in_R8 >> 0x20),(uint8_t *)CONCAT44(in_R9D,iVar1),src_stride1,
                     (uint8_t *)CONCAT44(in_stack_ffffffffffffffbc,src1_stride_u),
                     in_stack_ffffffffffffffb4,(int)in_RDI,in_stack_fffffffffffffff8,unaff_retaddr);
    src_stride0 = (int)((ulong)in_R8 >> 0x20);
    width_00 = (int)in_RDI;
    InterpolatePlane((uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),src_stride0,
                     (uint8_t *)CONCAT44(in_R9D,iVar1),src_stride1,
                     (uint8_t *)CONCAT44(in_stack_ffffffffffffffbc,src1_stride_u),
                     in_stack_ffffffffffffffb4,width_00,in_stack_fffffffffffffff8,unaff_retaddr);
    InterpolatePlane((uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),src_stride0,
                     (uint8_t *)CONCAT44(in_R9D,iVar1),src_stride1,
                     (uint8_t *)CONCAT44(in_stack_ffffffffffffffbc,src1_stride_u),
                     in_stack_ffffffffffffffb4,width_00,in_stack_fffffffffffffff8,unaff_retaddr);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int I420Interpolate(const uint8_t* src0_y,
                    int src0_stride_y,
                    const uint8_t* src0_u,
                    int src0_stride_u,
                    const uint8_t* src0_v,
                    int src0_stride_v,
                    const uint8_t* src1_y,
                    int src1_stride_y,
                    const uint8_t* src1_u,
                    int src1_stride_u,
                    const uint8_t* src1_v,
                    int src1_stride_v,
                    uint8_t* dst_y,
                    int dst_stride_y,
                    uint8_t* dst_u,
                    int dst_stride_u,
                    uint8_t* dst_v,
                    int dst_stride_v,
                    int width,
                    int height,
                    int interpolation) {
  int halfwidth = (width + 1) >> 1;
  int halfheight = (height + 1) >> 1;
  if (!src0_y || !src0_u || !src0_v || !src1_y || !src1_u || !src1_v ||
      !dst_y || !dst_u || !dst_v || width <= 0 || height == 0) {
    return -1;
  }
  InterpolatePlane(src0_y, src0_stride_y, src1_y, src1_stride_y, dst_y,
                   dst_stride_y, width, height, interpolation);
  InterpolatePlane(src0_u, src0_stride_u, src1_u, src1_stride_u, dst_u,
                   dst_stride_u, halfwidth, halfheight, interpolation);
  InterpolatePlane(src0_v, src0_stride_v, src1_v, src1_stride_v, dst_v,
                   dst_stride_v, halfwidth, halfheight, interpolation);
  return 0;
}